

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int av1_mv_bit_cost(MV *mv,MV *ref_mv,int *mvjcost,int **mvcost,int weight)

{
  int iVar1;
  int **in_RCX;
  int *in_RDX;
  MV *in_RSI;
  int in_R8D;
  MV diff;
  
  iVar1 = mv_cost(in_RSI,in_RDX,in_RCX);
  return iVar1 * in_R8D + 0x40 >> 7;
}

Assistant:

int av1_mv_bit_cost(const MV *mv, const MV *ref_mv, const int *mvjcost,
                    int *const mvcost[2], int weight) {
  const MV diff = { mv->row - ref_mv->row, mv->col - ref_mv->col };
  return ROUND_POWER_OF_TWO(
      mv_cost(&diff, mvjcost, CONVERT_TO_CONST_MVCOST(mvcost)) * weight, 7);
}